

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>::erase
          (iterator *__return_storage_ptr__,
          QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*> *this,
          const_iterator it)

{
  Chain *pCVar1;
  MultiNodeChain<QPersistentModelIndexData_*> *pMVar2;
  Data *pDVar3;
  Span *pSVar4;
  MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*> *pMVar5;
  ulong uVar6;
  Chain **ppCVar7;
  ulong uVar8;
  Span *pSVar9;
  uint uVar10;
  uchar *puVar12;
  long in_FS_OFFSET;
  Bucket bucket;
  piter pVar13;
  iterator local_48;
  long local_28;
  ulong uVar11;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.d = (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  detach(&local_48,this,it);
  ppCVar7 = local_48.e;
  __return_storage_ptr__->e = local_48.e;
  (__return_storage_ptr__->i).d = local_48.i.d;
  (__return_storage_ptr__->i).bucket = local_48.i.bucket;
  pCVar1 = *local_48.e;
  pMVar2 = pCVar1->next;
  *local_48.e = pMVar2;
  operator_delete(pCVar1,0x10);
  if (pMVar2 != (MultiNodeChain<QPersistentModelIndexData_*> *)0x0) goto LAB_003f5195;
  pMVar5 = QHashPrivate::
           iterator<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           ::node(&__return_storage_ptr__->i);
  if (ppCVar7 == &pMVar5->value) {
    uVar6 = (__return_storage_ptr__->i).bucket;
    pSVar9 = ((__return_storage_ptr__->i).d)->spans + (uVar6 >> 7);
    uVar10 = (uint)uVar6 & 0x7f;
    uVar11 = (ulong)uVar10;
    bucket.index._0_4_ = uVar10;
    bucket.span = pSVar9;
    bucket.index._4_4_ = 0;
    QHashPrivate::
    Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>::
    erase(this->d,bucket);
    pDVar3 = this->d;
    pSVar4 = pDVar3->spans;
    uVar6 = ((long)pSVar9 - (long)pSVar4) / 0x90;
    uVar8 = uVar6 << 7 | uVar11;
    pVar13.bucket = uVar8;
    pVar13.d = pDVar3;
    if ((uVar8 == pDVar3->numBuckets - 1) || (pSVar9->offsets[uVar11] == 0xff)) goto LAB_003f513a;
    uVar6 = uVar6 & 0x1ffffffffffffff;
    pSVar9 = pSVar4 + uVar6;
    puVar12 = pSVar4[uVar6].offsets + uVar11;
LAB_003f5175:
    ppCVar7 = (Chain **)&pSVar9->entries[*puVar12].storage.field_0x18;
  }
  else {
LAB_003f513a:
    pVar13 = QHashPrivate::
             iterator<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
             ::operator++(&local_48.i);
    if (pVar13.d !=
        (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
         *)0x0) {
      pSVar4 = (pVar13.d)->spans;
      uVar6 = pVar13.bucket >> 7;
      pSVar9 = pSVar4 + uVar6;
      puVar12 = pSVar4[uVar6].offsets + ((uint)pVar13.bucket & 0x7f);
      goto LAB_003f5175;
    }
    ppCVar7 = (Chain **)0x0;
  }
  __return_storage_ptr__->i = pVar13;
  __return_storage_ptr__->e = ppCVar7;
LAB_003f5195:
  this->m_size = this->m_size + -1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(d);
        iterator iter = detach(it);
        iterator i = iter;
        Chain *e = *i.e;
        Chain *next = e->next;
        *i.e = next;
        delete e;
        if (!next) {
            if (i.e == &i.i.node()->value) {
                // last remaining entry, erase
                typename Data::Bucket bucket(i.i);
                d->erase(bucket);
                if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
                    i = iterator(++iter.i);
                else // 'i' currently has a nullptr chain. So, we must recreate it
                    i = iterator(bucket.toIterator(d));
            } else {
                i = iterator(++iter.i);
            }
        }
        --m_size;
        Q_ASSERT(m_size >= 0);
        return i;
    }